

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall sznet::net::TcpServer::~TcpServer(TcpServer *this)

{
  _Base_ptr *pp_Var1;
  ulong __n;
  _Base_ptr p_Var2;
  _Base_ptr this_00;
  _Manager_type p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar4;
  int iVar5;
  TcpServer *pTVar6;
  bool bVar7;
  uint uVar8;
  _Base_ptr p_Var9;
  _Base_ptr this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  EventLoop *pEVar10;
  SourceFile file;
  Logger local_1038;
  _Any_data local_68;
  code *pcStack_58;
  code *pcStack_50;
  _Rb_tree_node_base *local_40;
  TcpServer *local_38;
  
  pEVar10 = this->m_loop;
  bVar7 = EventLoop::isInLoopThread(pEVar10);
  if (!bVar7) {
    EventLoop::abortNotInLoopThread(pEVar10);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0xd;
    file.m_data = "TcpServer.cpp";
    Logger::Logger(&local_1038,file,0x22,TRACE,"~TcpServer");
    iVar5 = (int)&local_1038 + 0xfb0;
    uVar8 = iVar5 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
    if (0x17 < uVar8) {
      builtin_strncpy(local_1038.m_impl.m_stream.m_buffer.m_cur,"TcpServer::~TcpServer [",0x17);
      local_1038.m_impl.m_stream.m_buffer.m_cur = local_1038.m_impl.m_stream.m_buffer.m_cur + 0x17;
      uVar8 = iVar5 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(int)uVar8) {
      memcpy(local_1038.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,__n);
      local_1038.m_impl.m_stream.m_buffer.m_cur = local_1038.m_impl.m_stream.m_buffer.m_cur + __n;
      uVar8 = iVar5 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
    }
    if (0xd < uVar8) {
      builtin_strncpy(local_1038.m_impl.m_stream.m_buffer.m_cur,"] destructing",0xd);
      local_1038.m_impl.m_stream.m_buffer.m_cur = local_1038.m_impl.m_stream.m_buffer.m_cur + 0xd;
    }
    Logger::~Logger(&local_1038);
  }
  p_Var9 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_38 = this;
  if (p_Var9 != local_40) {
    do {
      p_Var2 = p_Var9[1]._M_parent;
      this_00 = p_Var9[1]._M_left;
      pp_Var1 = &p_Var9[1]._M_parent;
      if (this_00 == (_Base_ptr)0x0) {
        *pp_Var1 = (_Base_ptr)0x0;
        p_Var9[1]._M_left = (_Base_ptr)0x0;
        pEVar10 = (EventLoop *)p_Var2->_M_left;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
          this_02 = p_Var9[1]._M_left;
          *pp_Var1 = (_Base_ptr)0x0;
          p_Var9[1]._M_left = (_Base_ptr)0x0;
          if (this_02 != (_Base_ptr)0x0) goto LAB_00120aa8;
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          *pp_Var1 = (_Base_ptr)0x0;
          p_Var9[1]._M_left = (_Base_ptr)0x0;
          this_02 = this_00;
LAB_00120aa8:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        }
        pEVar10 = (EventLoop *)p_Var2->_M_left;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      pcStack_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = operator_new(0x20);
      pcStack_50 = std::
                   _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                   ::_M_invoke;
      *(code **)local_68._M_unused._0_8_ = TcpConnection::connectDestroyed;
      *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
      *(_Base_ptr *)((long)local_68._M_unused._0_8_ + 0x10) = p_Var2;
      *(_Base_ptr *)((long)local_68._M_unused._0_8_ + 0x18) = this_00;
      pcStack_58 = std::
                   _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                   ::_M_manager;
      EventLoop::runInLoop(pEVar10,(Functor *)&local_68);
      if (pcStack_58 != (code *)0x0) {
        (*pcStack_58)(&local_68,&local_68,__destroy_functor);
      }
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_40);
  }
  pTVar6 = local_38;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  ::~_Rb_tree(&(local_38->m_connections)._M_t);
  p_Var3 = (pTVar6->m_threadInitCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pTVar6->m_threadInitCallback,(_Any_data *)&pTVar6->m_threadInitCallback,
              __destroy_functor);
  }
  p_Var3 = (pTVar6->m_writeCompleteCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pTVar6->m_writeCompleteCallback,
              (_Any_data *)&pTVar6->m_writeCompleteCallback,__destroy_functor);
  }
  p_Var3 = (pTVar6->m_messageCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pTVar6->m_messageCallback,(_Any_data *)&pTVar6->m_messageCallback,
              __destroy_functor);
  }
  p_Var3 = (pTVar6->m_connectionCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pTVar6->m_connectionCallback,(_Any_data *)&pTVar6->m_connectionCallback,
              __destroy_functor);
  }
  this_01 = (pTVar6->m_threadPool).
            super___shared_ptr<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  std::unique_ptr<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>::~unique_ptr
            (&pTVar6->m_acceptor);
  pcVar4 = (pTVar6->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(pTVar6->m_name).field_2) {
    operator_delete(pcVar4);
  }
  pcVar4 = (pTVar6->m_ipPort)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(pTVar6->m_ipPort).field_2) {
    operator_delete(pcVar4);
  }
  return;
}

Assistant:

TcpServer::~TcpServer()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "TcpServer::~TcpServer [" << m_name << "] destructing";

	for (auto& item : m_connections)
	{
		TcpConnectionPtr conn(item.second);
		item.second.reset();
		conn->getLoop()->runInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
	}
}